

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCurrentTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1122e::TestCanSetandGetDetails::RunImpl(TestCanSetandGetDetails *this)

{
  TestResults *this_00;
  bool bVar1;
  TestDetails **ppTVar2;
  TestResults **ppTVar3;
  TestDetails local_60;
  TestDetails *local_30;
  TestDetails *details;
  ScopedCurrentTest scopedTest;
  bool ok;
  TestCanSetandGetDetails *this_local;
  
  scopedTest.m_oldTestDetails._7_1_ = 0;
  ScopedCurrentTest::ScopedCurrentTest((ScopedCurrentTest *)&details);
  local_30 = (TestDetails *)0x3039;
  ppTVar2 = UnitTest::CurrentTest::Details();
  *ppTVar2 = (TestDetails *)0x3039;
  ppTVar2 = UnitTest::CurrentTest::Details();
  scopedTest.m_oldTestDetails._7_1_ = *ppTVar2 == local_30;
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)&details);
  bVar1 = UnitTest::Check<bool>((bool)(scopedTest.m_oldTestDetails._7_1_ & 1));
  if (!bVar1) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar3;
    ppTVar2 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_60,*ppTVar2,0x14);
    UnitTest::TestResults::OnTestFailure(this_00,&local_60,"ok");
  }
  return;
}

Assistant:

TEST(CanSetandGetDetails)
{
	bool ok = false;
	{
		ScopedCurrentTest scopedTest;

		const UnitTest::TestDetails* details = reinterpret_cast< const UnitTest::TestDetails* >(12345);
		UnitTest::CurrentTest::Details() = details;

		ok = (UnitTest::CurrentTest::Details() == details);
	}

	CHECK(ok);
}